

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalNinjaGenerator::CheckISPC(cmGlobalNinjaGenerator *this,cmMakefile *mf)

{
  bool bVar1;
  ostream *poVar2;
  string sStack_1b8;
  ostringstream e;
  
  bVar1 = this->NinjaSupportsMultipleOutputs;
  if (bVar1 == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar2 = std::operator<<((ostream *)&e,
                             "The Ninja generator does not support ISPC using Ninja version\n  ");
    poVar2 = std::operator<<(poVar2,(string *)&this->NinjaVersion);
    poVar2 = std::operator<<(poVar2,"\ndue to lack of required features.  Ninja ");
    RequiredNinjaVersionForMultipleOutputs_abi_cxx11_();
    poVar2 = std::operator<<(poVar2,(string *)&sStack_1b8);
    std::operator<<(poVar2," or higher is required.");
    std::__cxx11::string::~string((string *)&sStack_1b8);
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(mf,FATAL_ERROR,&sStack_1b8);
    std::__cxx11::string::~string((string *)&sStack_1b8);
    cmSystemTools::s_FatalErrorOccurred = true;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  return bVar1;
}

Assistant:

bool cmGlobalNinjaGenerator::CheckISPC(cmMakefile* mf) const
{
  if (this->NinjaSupportsMultipleOutputs) {
    return true;
  }

  std::ostringstream e;
  /* clang-format off */
  e <<
    "The Ninja generator does not support ISPC using Ninja version\n"
    "  " << this->NinjaVersion << "\n"
    "due to lack of required features.  "
    "Ninja " << RequiredNinjaVersionForMultipleOutputs() <<
    " or higher is required."
    ;
  /* clang-format on */
  mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
  cmSystemTools::SetFatalErrorOccurred();
  return false;
}